

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

void lyd_validate_obsolete(lyd_node *node)

{
  bool bVar1;
  lysc_node *local_18;
  lysc_node *snode;
  lyd_node *node_local;
  
  local_18 = node->schema;
  do {
    if ((local_18->flags & 0x10) != 0) {
      ly_log_location((lysc_node *)0x0,node,(char *)0x0,(ly_in *)0x0);
      ly_log(local_18->module->ctx,LY_LLWRN,LY_SUCCESS,
             "Obsolete schema node \"%s\" instantiated in data.",local_18->name);
      ly_log_location_revert(0,1,0,0);
      return;
    }
    local_18 = local_18->parent;
    bVar1 = false;
    if (local_18 != (lysc_node *)0x0) {
      bVar1 = (local_18->nodetype & 0x82) != 0;
    }
  } while (bVar1);
  return;
}

Assistant:

static void
lyd_validate_obsolete(const struct lyd_node *node)
{
    const struct lysc_node *snode;

    snode = node->schema;
    do {
        if (snode->flags & LYS_STATUS_OBSLT) {
            LOG_LOCSET(NULL, node);
            LOGWRN(snode->module->ctx, "Obsolete schema node \"%s\" instantiated in data.", snode->name);
            LOG_LOCBACK(0, 1);
            break;
        }

        snode = snode->parent;
    } while (snode && (snode->nodetype & (LYS_CHOICE | LYS_CASE)));
}